

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_siz(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  opj_image_t *poVar1;
  int iVar2;
  uint uVar3;
  OPJ_BYTE *pOVar4;
  OPJ_SIZE_T OVar5;
  OPJ_BYTE *new_header_tile_data;
  opj_image_comp_t *l_img_comp;
  opj_cp_t *cp;
  opj_image_t *l_image;
  OPJ_BYTE *l_current_ptr;
  OPJ_UINT32 l_size_len;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x7a1,
                  "OPJ_BOOL opj_j2k_write_siz(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x7a3,
                    "OPJ_BOOL opj_j2k_write_siz(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    poVar1 = p_j2k->m_private_image;
    iVar2 = poVar1->numcomps * 3;
    uVar3 = iVar2 + 0x28;
    new_header_tile_data = (OPJ_BYTE *)poVar1->comps;
    if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar3) {
      pOVar4 = (OPJ_BYTE *)
               opj_realloc((p_j2k->m_specific_param).m_encoder.m_header_tile_data,(ulong)uVar3);
      if (pOVar4 == (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
        (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
        opj_event_msg(p_manager,1,"Not enough memory for the SIZ marker\n");
        return 0;
      }
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar4;
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar3;
    }
    pOVar4 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    opj_write_bytes_LE(pOVar4,0xff51,2);
    opj_write_bytes_LE(pOVar4 + 2,iVar2 + 0x26,2);
    opj_write_bytes_LE(pOVar4 + 4,(uint)(p_j2k->m_cp).rsiz,2);
    opj_write_bytes_LE(pOVar4 + 6,poVar1->x1,4);
    opj_write_bytes_LE(pOVar4 + 10,poVar1->y1,4);
    opj_write_bytes_LE(pOVar4 + 0xe,poVar1->x0,4);
    opj_write_bytes_LE(pOVar4 + 0x12,poVar1->y0,4);
    opj_write_bytes_LE(pOVar4 + 0x16,(p_j2k->m_cp).tdx,4);
    opj_write_bytes_LE(pOVar4 + 0x1a,(p_j2k->m_cp).tdy,4);
    opj_write_bytes_LE(pOVar4 + 0x1e,(p_j2k->m_cp).tx0,4);
    opj_write_bytes_LE(pOVar4 + 0x22,(p_j2k->m_cp).ty0,4);
    opj_write_bytes_LE(pOVar4 + 0x26,poVar1->numcomps,2);
    l_image = (opj_image_t *)(pOVar4 + 0x28);
    for (l_current_ptr._4_4_ = 0; l_current_ptr._4_4_ < poVar1->numcomps;
        l_current_ptr._4_4_ = l_current_ptr._4_4_ + 1) {
      opj_write_bytes_LE((OPJ_BYTE *)l_image,
                         *(int *)(new_header_tile_data + 0x18) + -1 +
                         *(int *)(new_header_tile_data + 0x20) * 0x80,1);
      opj_write_bytes_LE((OPJ_BYTE *)((long)&l_image->x0 + 1),*(OPJ_UINT32 *)new_header_tile_data,1)
      ;
      opj_write_bytes_LE((OPJ_BYTE *)((long)&l_image->x0 + 2),
                         *(OPJ_UINT32 *)(new_header_tile_data + 4),1);
      l_image = (opj_image_t *)((long)&l_image->x0 + 3);
      new_header_tile_data = new_header_tile_data + 0x40;
    }
    OVar5 = opj_stream_write_data
                      (p_stream,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,(ulong)uVar3,
                       p_manager);
    p_j2k_local._4_4_ = (uint)(OVar5 == uVar3);
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x7a2,
                "OPJ_BOOL opj_j2k_write_siz(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_siz(opj_j2k_t *p_j2k,
                                  opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i;
    OPJ_UINT32 l_size_len;
    OPJ_BYTE * l_current_ptr;
    opj_image_t * l_image = 00;
    opj_cp_t *cp = 00;
    opj_image_comp_t * l_img_comp = 00;

    /* preconditions */
    assert(p_stream != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_image = p_j2k->m_private_image;
    cp = &(p_j2k->m_cp);
    l_size_len = 40 + 3 * l_image->numcomps;
    l_img_comp = l_image->comps;

    if (l_size_len > p_j2k->m_specific_param.m_encoder.m_header_tile_data_size) {

        OPJ_BYTE *new_header_tile_data = (OPJ_BYTE *) opj_realloc(
                                             p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_size_len);
        if (! new_header_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
            p_j2k->m_specific_param.m_encoder.m_header_tile_data = NULL;
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory for the SIZ marker\n");
            return OPJ_FALSE;
        }
        p_j2k->m_specific_param.m_encoder.m_header_tile_data = new_header_tile_data;
        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = l_size_len;
    }

    l_current_ptr = p_j2k->m_specific_param.m_encoder.m_header_tile_data;

    /* write SOC identifier */
    opj_write_bytes(l_current_ptr, J2K_MS_SIZ, 2);  /* SIZ */
    l_current_ptr += 2;

    opj_write_bytes(l_current_ptr, l_size_len - 2, 2); /* L_SIZ */
    l_current_ptr += 2;

    opj_write_bytes(l_current_ptr, cp->rsiz, 2);    /* Rsiz (capabilities) */
    l_current_ptr += 2;

    opj_write_bytes(l_current_ptr, l_image->x1, 4); /* Xsiz */
    l_current_ptr += 4;

    opj_write_bytes(l_current_ptr, l_image->y1, 4); /* Ysiz */
    l_current_ptr += 4;

    opj_write_bytes(l_current_ptr, l_image->x0, 4); /* X0siz */
    l_current_ptr += 4;

    opj_write_bytes(l_current_ptr, l_image->y0, 4); /* Y0siz */
    l_current_ptr += 4;

    opj_write_bytes(l_current_ptr, cp->tdx, 4);             /* XTsiz */
    l_current_ptr += 4;

    opj_write_bytes(l_current_ptr, cp->tdy, 4);             /* YTsiz */
    l_current_ptr += 4;

    opj_write_bytes(l_current_ptr, cp->tx0, 4);             /* XT0siz */
    l_current_ptr += 4;

    opj_write_bytes(l_current_ptr, cp->ty0, 4);             /* YT0siz */
    l_current_ptr += 4;

    opj_write_bytes(l_current_ptr, l_image->numcomps, 2);   /* Csiz */
    l_current_ptr += 2;

    for (i = 0; i < l_image->numcomps; ++i) {
        /* TODO here with MCT ? */
        opj_write_bytes(l_current_ptr, l_img_comp->prec - 1 + (l_img_comp->sgnd << 7),
                        1);      /* Ssiz_i */
        ++l_current_ptr;

        opj_write_bytes(l_current_ptr, l_img_comp->dx, 1);      /* XRsiz_i */
        ++l_current_ptr;

        opj_write_bytes(l_current_ptr, l_img_comp->dy, 1);      /* YRsiz_i */
        ++l_current_ptr;

        ++l_img_comp;
    }

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_size_len,
                              p_manager) != l_size_len) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}